

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O1

ZyanStatus
ZydisFormatterATTPrintAddressABS
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZyanUSize ZVar2;
  ulong uVar3;
  void *pvVar4;
  ZyanUSize ZVar5;
  ZyanStatus ZVar6;
  ulong uVar7;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x170,
                  "ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x171,
                  "ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x172,
                  "ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (((context->instruction->meta).branch_type != ZYDIS_BRANCH_TYPE_NONE) &&
     (context->operand->type == ZYDIS_OPERAND_TYPE_MEMORY)) {
    if (buffer->is_token_list == '\0') {
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
        __assert_fail("!destination->vector.allocator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xeb,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      ZVar2 = (buffer->string).vector.size;
      if (ZVar2 == 0) {
        __assert_fail("destination->vector.size && source->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xec,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      uVar3 = (buffer->string).vector.capacity;
      ZVar6 = 0x80100009;
      if (ZVar2 + 1 <= uVar3) {
        *(undefined2 *)((long)(buffer->string).vector.data + (ZVar2 - 1)) = 0x2a;
        ZVar5 = (buffer->string).vector.size;
        pvVar4 = (buffer->string).vector.data;
        (buffer->string).vector.size = ZVar5 + 1;
        ZVar6 = 0x100000;
        if (*(char *)((long)pvVar4 + ZVar5) != '\0') {
          __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0xf7,
                        "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
          ;
        }
      }
      if (uVar3 < ZVar2 + 1) {
        return ZVar6;
      }
    }
    else {
      ZVar2 = (buffer->string).vector.size;
      if (0xfe < ZVar2 - 1) {
        __assert_fail("(len > 0) && (len < 256)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                      ,0xe7,
                      "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                     );
      }
      uVar3 = buffer->capacity;
      ZVar6 = 0x80100009;
      if (ZVar2 + 4 < uVar3) {
        pvVar4 = (buffer->string).vector.data;
        *(char *)((long)pvVar4 + -1) = (char)ZVar2;
        *(undefined4 *)((long)pvVar4 + ZVar2) = 0x2a0002;
        uVar7 = buffer->capacity - (ZVar2 + 2);
        buffer->capacity = uVar7;
        ppvVar1 = &(buffer->string).vector.data;
        *ppvVar1 = (void *)((long)*ppvVar1 + ZVar2 + 2);
        (buffer->string).vector.size = 2;
        if (0xfe < uVar7) {
          uVar7 = 0xff;
        }
        (buffer->string).vector.capacity = uVar7;
        ZVar6 = 0x100000;
      }
      if (uVar3 <= ZVar2 + 4) {
        return ZVar6;
      }
    }
  }
  ZVar6 = ZydisFormatterBasePrintAddressABS(formatter,buffer,context);
  return ZVar6;
}

Assistant:

ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    if ((context->instruction->meta.branch_type != ZYDIS_BRANCH_TYPE_NONE) &&
        (context->operand->type == ZYDIS_OPERAND_TYPE_MEMORY))
    {
        ZYDIS_BUFFER_APPEND(buffer, MUL);
    }

    return ZydisFormatterBasePrintAddressABS(formatter, buffer, context);
}